

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::fastpackwithoutmask_8(uint32_t *in,uint32_t *out,uint32_t bit)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint32_t *puVar7;
  logic_error *this;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (bit < 0x21) {
    switch(bit) {
    case 1:
      puVar7 = __fastpackwithoutmask1_8(in,out);
      return puVar7;
    case 2:
      puVar7 = __fastpackwithoutmask2_8(in,out);
      return puVar7;
    case 3:
      puVar7 = __fastpackwithoutmask3_8(in,out);
      return puVar7;
    case 4:
      puVar7 = __fastpackwithoutmask4_8(in,out);
      return puVar7;
    case 5:
      puVar7 = __fastpackwithoutmask5_8(in,out);
      return puVar7;
    case 6:
      puVar7 = __fastpackwithoutmask6_8(in,out);
      return puVar7;
    case 7:
      puVar7 = __fastpackwithoutmask7_8(in,out);
      return puVar7;
    case 8:
      uVar1 = in[5];
      uVar2 = in[4];
      uVar3 = in[6];
      *out = in[3] << 0x18 | in[2] << 0x10 | in[1] << 8 | *in;
      out[1] = in[7] << 0x18 | uVar3 << 0x10 | uVar1 << 8 | uVar2;
      out = out + 2;
      break;
    case 9:
      puVar7 = __fastpackwithoutmask9_8(in,out);
      return puVar7;
    case 10:
      puVar7 = __fastpackwithoutmask10_8(in,out);
      return puVar7;
    case 0xb:
      puVar7 = __fastpackwithoutmask11_8(in,out);
      return puVar7;
    case 0xc:
      puVar7 = __fastpackwithoutmask12_8(in,out);
      return puVar7;
    case 0xd:
      puVar7 = __fastpackwithoutmask13_8(in,out);
      return puVar7;
    case 0xe:
      puVar7 = __fastpackwithoutmask14_8(in,out);
      return puVar7;
    case 0xf:
      puVar7 = __fastpackwithoutmask15_8(in,out);
      return puVar7;
    case 0x10:
      vpmovsxbd_avx(ZEXT416(0x18100800));
      auVar8 = vpgatherdd_avx512vl(*(undefined4 *)
                                    ((long)in +
                                    (long)&switchD_0016adf2::switchdataD_001a59c4 +
                                    (long)(int)(&switchD_0016adf2::switchdataD_001a59c4)[bit]));
      vpmovsxbd_avx(ZEXT416(0x1c140c04));
      auVar9 = vpgatherdd_avx512vl(*(undefined4 *)
                                    ((long)in +
                                    (long)&switchD_0016adf2::switchdataD_001a59c4 +
                                    (long)(int)(&switchD_0016adf2::switchdataD_001a59c4)[bit]));
      auVar9 = vpslld_avx(auVar9,0x10);
      auVar8 = vpor_avx(auVar9,auVar8);
      *(undefined1 (*) [16])out = auVar8;
      out = out + 4;
      break;
    case 0x11:
      puVar7 = __fastpackwithoutmask17_8(in,out);
      return puVar7;
    case 0x12:
      puVar7 = __fastpackwithoutmask18_8(in,out);
      return puVar7;
    case 0x13:
      puVar7 = __fastpackwithoutmask19_8(in,out);
      return puVar7;
    case 0x14:
      puVar7 = __fastpackwithoutmask20_8(in,out);
      return puVar7;
    case 0x15:
      puVar7 = __fastpackwithoutmask21_8(in,out);
      return puVar7;
    case 0x16:
      puVar7 = __fastpackwithoutmask22_8(in,out);
      return puVar7;
    case 0x17:
      puVar7 = __fastpackwithoutmask23_8(in,out);
      return puVar7;
    case 0x18:
      puVar7 = __fastpackwithoutmask24_8(in,out);
      return puVar7;
    case 0x19:
      puVar7 = __fastpackwithoutmask25_8(in,out);
      return puVar7;
    case 0x1a:
      puVar7 = __fastpackwithoutmask26_8(in,out);
      return puVar7;
    case 0x1b:
      puVar7 = __fastpackwithoutmask27_8(in,out);
      return puVar7;
    case 0x1c:
      puVar7 = __fastpackwithoutmask28_8(in,out);
      return puVar7;
    case 0x1d:
      puVar7 = __fastpackwithoutmask29_8(in,out);
      return puVar7;
    case 0x1e:
      puVar7 = __fastpackwithoutmask30_8(in,out);
      return puVar7;
    case 0x1f:
      puVar7 = __fastpackwithoutmask31_8(in,out);
      return puVar7;
    case 0x20:
      uVar4 = *(undefined8 *)(in + 2);
      uVar5 = *(undefined8 *)(in + 4);
      uVar6 = *(undefined8 *)(in + 6);
      *(undefined8 *)out = *(undefined8 *)in;
      *(undefined8 *)(out + 2) = uVar4;
      *(undefined8 *)(out + 4) = uVar5;
      *(undefined8 *)(out + 6) = uVar6;
      out = out + 8;
    }
    return out;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"number of bits is unsupported");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

uint32_t *fastpackwithoutmask_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out,
                                const uint32_t bit) {
  switch (bit) {
  case 0:
    return nullpacker(in, out);

  case 1:
    return __fastpackwithoutmask1_8(in, out);

  case 2:
    return __fastpackwithoutmask2_8(in, out);

  case 3:
    return __fastpackwithoutmask3_8(in, out);

  case 4:
    return __fastpackwithoutmask4_8(in, out);

  case 5:
    return __fastpackwithoutmask5_8(in, out);

  case 6:
    return __fastpackwithoutmask6_8(in, out);

  case 7:
    return __fastpackwithoutmask7_8(in, out);

  case 8:
    return __fastpackwithoutmask8_8(in, out);

  case 9:
    return __fastpackwithoutmask9_8(in, out);

  case 10:
    return __fastpackwithoutmask10_8(in, out);

  case 11:
    return __fastpackwithoutmask11_8(in, out);

  case 12:
    return __fastpackwithoutmask12_8(in, out);

  case 13:
    return __fastpackwithoutmask13_8(in, out);

  case 14:
    return __fastpackwithoutmask14_8(in, out);

  case 15:
    return __fastpackwithoutmask15_8(in, out);

  case 16:
    return __fastpackwithoutmask16_8(in, out);

  case 17:
    return __fastpackwithoutmask17_8(in, out);

  case 18:
    return __fastpackwithoutmask18_8(in, out);

  case 19:
    return __fastpackwithoutmask19_8(in, out);

  case 20:
    return __fastpackwithoutmask20_8(in, out);

  case 21:
    return __fastpackwithoutmask21_8(in, out);

  case 22:
    return __fastpackwithoutmask22_8(in, out);

  case 23:
    return __fastpackwithoutmask23_8(in, out);

  case 24:
    return __fastpackwithoutmask24_8(in, out);

  case 25:
    return __fastpackwithoutmask25_8(in, out);

  case 26:
    return __fastpackwithoutmask26_8(in, out);

  case 27:
    return __fastpackwithoutmask27_8(in, out);

  case 28:
    return __fastpackwithoutmask28_8(in, out);

  case 29:
    return __fastpackwithoutmask29_8(in, out);

  case 30:
    return __fastpackwithoutmask30_8(in, out);

  case 31:
    return __fastpackwithoutmask31_8(in, out);

  case 32:
    return __fastpackwithoutmask32_8(in, out);

  default:
    break;
  }
  throw std::logic_error("number of bits is unsupported");
}